

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_ItemSimilarityRecommender_2eproto::TableStruct::Shutdown(void)

{
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>
              *)_ItemSimilarityRecommender_ConnectedItem_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ItemSimilarityRecommender_SimilarItems> *
             )_ItemSimilarityRecommender_SimilarItems_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ItemSimilarityRecommender>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ItemSimilarityRecommender> *)
             _ItemSimilarityRecommender_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _ItemSimilarityRecommender_ConnectedItem_default_instance_.Shutdown();
  _ItemSimilarityRecommender_SimilarItems_default_instance_.Shutdown();
  _ItemSimilarityRecommender_default_instance_.Shutdown();
}